

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_get_index(Integer memhandle,MA_AccessIndex *index)

{
  Boolean BVar1;
  ulong *in_RSI;
  AD *ad;
  AD **in_stack_00000020;
  Integer in_stack_00000028;
  long *local_20;
  ulong local_8;
  
  ma_stats.calls[5] = ma_stats.calls[5] + 1;
  BVar1 = mh2ad(in_stack_00000028,in_stack_00000020,memhandle._4_4_,(char *)index);
  if (BVar1 != 0) {
    *in_RSI = (ulong)(local_20[6] - (long)ma_base[*local_20]) / (ulong)(long)ma_sizeof[*local_20];
  }
  local_8 = (ulong)(BVar1 != 0);
  return local_8;
}

Assistant:

public Boolean MA_get_index(
    Integer    memhandle,    /* block to get index for */
    MA_AccessIndex    *index         /* RETURN: base index */)
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_get_index]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (mh2ad(memhandle, &ad, BL_HeapOrStack, "MA_get_index"))
    {
        /* compute index */
        *index = client_space_index(ad);

        /* success */
        return MA_TRUE;
    }
    else
    {
        /* failure */
        return MA_FALSE;
    }
}